

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

int __thiscall HDual::util_getBasisInvRow(HDual *this,int r,double *coef,int *inds,int *ninds)

{
  uint uVar1;
  pointer pdVar2;
  pointer piVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  HVector::clear(&this->row_ep);
  (this->row_ep).count = 1;
  *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = r;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[r] = 1.0;
  (this->row_ep).packFlag = true;
  HFactor::btran(this->factor,&this->row_ep,this->row_epDensity);
  uVar1 = this->numRow;
  pdVar2 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    coef[uVar4] = pdVar2[uVar4];
  }
  iVar6 = (this->row_ep).count;
  if ((int)uVar1 < iVar6 || iVar6 < 0) {
    printf("util_getBasisInvRow: row_ep.count < 0 or row_ep.count > numRow: %4d; %4d\n");
    iVar6 = -1;
  }
  else {
    piVar3 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = 0; lVar5 < iVar6; lVar5 = lVar5 + 1) {
      inds[lVar5] = piVar3[lVar5];
      iVar6 = (this->row_ep).count;
    }
  }
  *ninds = iVar6;
  std::ostream::flush();
  return 0;
}

Assistant:

int  HDual::util_getBasisInvRow(int r, double* coef, int* inds, int* ninds) {
  row_ep.clear();
  row_ep.count = 1;
  row_ep.index[0] = r;
  row_ep.array[r] = 1;
  row_ep.packFlag = true;
  factor->btran(row_ep, row_epDensity);
  //  printf("util_getBasisInvRow: nnz = %4d/%4d\n", row_ep.count, numRow);
  for (int row=0; row<numRow; row++) {
    //    printf("BasisInvRow(%4d) = %11g\n", row,  row_ep.array[row]);
    coef[row] = row_ep.array[row];
  }
  if (0 <= row_ep.count && row_ep.count <= numRow) {
    for (int ix=0; ix<row_ep.count; ix++) inds[ix] = row_ep.index[ix];
    ninds[0] = row_ep.count;
  } else {
    printf("util_getBasisInvRow: row_ep.count < 0 or row_ep.count > numRow: %4d; %4d\n", row_ep.count, numRow);
    ninds[0] = -1;
  }
  cout << flush;
  return 0;
}